

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

Matrix * projection(Matrix *__return_storage_ptr__,float c)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  
  Matrix::identity(__return_storage_ptr__,4);
  pvVar1 = Matrix::operator[](__return_storage_ptr__,3);
  (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[2] = -1.0 / c;
  return __return_storage_ptr__;
}

Assistant:

Matrix projection(const float c){
    Matrix Projection = Matrix::identity(4);
    Projection[3][2] = -1.f/c;
    return Projection;
}